

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_false>::eval_divide_knuth
          (uintwide_t<32U,_unsigned_int,_void,_false> *this,
          uintwide_t<32U,_unsigned_int,_void,_false> *other,
          uintwide_t<32U,_unsigned_int,_void,_false> *remainder)

{
  value_type_conflict vVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  vVar1 = (this->values).super_array<unsigned_int,_1UL>.elems[0];
  if ((other->values).super_array<unsigned_int,_1UL>.elems[0] == 0) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0xffffffff;
  }
  else if (vVar1 != 0) {
    lVar9 = (ulong)(vVar1 != 0) << 2;
    lVar10 = 0;
    do {
      bVar7 = 0;
      if (lVar10 == -4) break;
      uVar2 = *(uint *)((long)(this->values).super_array<unsigned_int,_1UL>.elems + lVar10);
      uVar3 = *(uint *)((long)(other->values).super_array<unsigned_int,_1UL>.elems + lVar10);
      bVar7 = -(uVar2 <= uVar3) | 1;
      lVar10 = lVar10 + -4;
    } while (uVar2 == uVar3);
    if (bVar7 == 0) {
      (this->values).super_array<unsigned_int,_1UL>.elems[0] = 1;
      if (remainder != (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
      }
    }
    else if (bVar7 == 0xff) {
      if (remainder != (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] =
             (this->values).super_array<unsigned_int,_1UL>.elems[0];
      }
      (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
    }
    else {
      uVar2 = (other->values).super_array<unsigned_int,_1UL>.elems[0];
      if (vVar1 == 0) {
        uVar8 = 0;
        iVar5 = 0;
      }
      else {
        uVar6 = 0;
        uVar8 = 0;
        do {
          uVar8 = CONCAT44((int)uVar8 - (int)uVar6 * uVar2,
                           *(undefined4 *)
                            ((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar9));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar8;
          uVar6 = SUB168(auVar4 / ZEXT416(uVar2),0);
          iVar5 = SUB164(auVar4 / ZEXT416(uVar2),0);
          *(int *)((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar9) = iVar5;
          lVar9 = lVar9 + -4;
        } while (lVar9 != 0);
      }
      if (remainder != (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = (int)uVar8 - iVar5 * uVar2;
      }
    }
    return;
  }
  if (remainder != (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
    (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
  }
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }